

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json.c
# Opt level: O3

LY_ERR json_print_string(ly_out *out,char *text)

{
  byte bVar1;
  LY_ERR in_EAX;
  LY_ERR LVar2;
  ushort **ppuVar3;
  char *format;
  uint uVar4;
  
  if (text == (char *)0x0) {
    return in_EAX;
  }
  ly_write_(out,"\"",1);
  bVar1 = *text;
  do {
    if (bVar1 == 0) {
      LVar2 = ly_write_(out,"\"",1);
      return LVar2;
    }
    uVar4 = (uint)bVar1;
    if (bVar1 < 0x22) {
      if (uVar4 == 9) {
        format = "\\t";
        goto LAB_0013de52;
      }
      if (uVar4 == 0xd) {
        format = "\\r";
        goto LAB_0013de52;
      }
LAB_0013de1d:
      ppuVar3 = __ctype_b_loc();
      if (((*ppuVar3)[uVar4] & 2) == 0) {
        ly_write_(out,text,1);
      }
      else {
        ly_print_(out,"\\u%.4X",(ulong)uVar4);
      }
    }
    else {
      if (bVar1 == 0x5c) {
        format = "\\\\";
      }
      else {
        if (uVar4 != 0x22) goto LAB_0013de1d;
        format = "\\\"";
      }
LAB_0013de52:
      ly_print_(out,format);
    }
    bVar1 = text[1];
    text = text + 1;
  } while( true );
}

Assistant:

static LY_ERR
json_print_string(struct ly_out *out, const char *text)
{
    uint64_t i;

    if (!text) {
        return LY_SUCCESS;
    }

    ly_write_(out, "\"", 1);
    for (i = 0; text[i]; i++) {
        const unsigned char byte = text[i];

        switch (byte) {
        case '"':
            ly_print_(out, "\\\"");
            break;
        case '\\':
            ly_print_(out, "\\\\");
            break;
        case '\r':
            ly_print_(out, "\\r");
            break;
        case '\t':
            ly_print_(out, "\\t");
            break;
        default:
            if (iscntrl(byte)) {
                /* control character */
                ly_print_(out, "\\u%.4X", byte);
            } else {
                /* printable character (even non-ASCII UTF8) */
                ly_write_(out, &text[i], 1);
            }
            break;
        }
    }
    ly_write_(out, "\"", 1);

    return LY_SUCCESS;
}